

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_slic_marker.cpp
# Opt level: O2

void __thiscall
ms_slic_marker_t::ms_slic_marker_t
          (ms_slic_marker_t *this,kstream *p__io,kstruct *p__parent,ms_slic_marker_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__ms_slic_marker_t_00280f50;
  (this->m_oem_id)._M_dataplus._M_p = (pointer)&(this->m_oem_id).field_2;
  (this->m_oem_id)._M_string_length = 0;
  (this->m_oem_id).field_2._M_local_buf[0] = '\0';
  (this->m_oem_table_id)._M_dataplus._M_p = (pointer)&(this->m_oem_table_id).field_2;
  (this->m_oem_table_id)._M_string_length = 0;
  (this->m_oem_table_id).field_2._M_local_buf[0] = '\0';
  (this->m_reserved)._M_dataplus._M_p = (pointer)&(this->m_reserved).field_2;
  (this->m_reserved)._M_string_length = 0;
  (this->m_reserved).field_2._M_local_buf[0] = '\0';
  (this->m_signature)._M_dataplus._M_p = (pointer)&(this->m_signature).field_2;
  (this->m_signature)._M_string_length = 0;
  (this->m_signature).field_2._M_local_buf[0] = '\0';
  this->m__parent = p__parent;
  this->m__root = this;
  _read(this);
  return;
}

Assistant:

void ms_slic_marker_t::_read() {
    m_type = m__io->read_u4le();
    m_len_marker = m__io->read_u4le();
    m_version = m__io->read_u4le();
    m_oem_id = m__io->read_bytes(6);
    m_oem_table_id = m__io->read_bytes(8);
    m_windows_flag = m__io->read_u8le();
    m_slic_version = m__io->read_u4le();
    m_reserved = m__io->read_bytes(16);
    m_signature = m__io->read_bytes(128);
}